

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorFinder.hpp
# Opt level: O2

void __thiscall
peach::fsm::OperatorFinder::OperatorFinder
          (OperatorFinder *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *operators)

{
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>const*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,peach::fsm::OperatorFinder::OperatorFinder(std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>const&)::_lambda(auto:1_const&)_1_>
            ((operators->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (operators->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

OperatorFinder(const std::vector<std::pair<std::string, token::tokenCategory_t>> &operators)
    {
        std::for_each(operators.begin(), operators.end(), [&](const auto &pat) {
            addOperatorPattern(pat.first, pat.second);
        });
    }